

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O0

singlecomplex * singlecomplexCalloc(size_t n)

{
  singlecomplex *psVar1;
  char local_128 [8];
  char msg [256];
  singlecomplex zero;
  size_t i;
  singlecomplex *buf;
  size_t n_local;
  
  memset(msg + 0xf8,0,8);
  psVar1 = (singlecomplex *)superlu_malloc(n << 3);
  if (psVar1 == (singlecomplex *)0x0) {
    sprintf(local_128,"%s at line %d in file %s\n",
            "SUPERLU_MALLOC failed for buf in singlecomplexCalloc()\n",0x2c2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cmemory.c");
    superlu_abort_and_exit(local_128);
  }
  zero.r = 0.0;
  zero.i = 0.0;
  for (; (ulong)zero < n; zero = (singlecomplex)((long)zero + 1)) {
    psVar1[(long)zero] = (singlecomplex)msg._248_8_;
  }
  return psVar1;
}

Assistant:

singlecomplex *singlecomplexCalloc(size_t n)
{
    singlecomplex *buf;
    register size_t i;
    singlecomplex zero = {0.0, 0.0};
    buf = (singlecomplex *) SUPERLU_MALLOC(n * (size_t) sizeof(singlecomplex));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC failed for buf in singlecomplexCalloc()\n");
    }
    for (i = 0; i < n; ++i) buf[i] = zero;
    return (buf);
}